

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O1

__int128 * __thiscall
calculator::ExpressionParser<__int128>::getInteger(ExpressionParser<__int128> *this)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  
  if (this->index_ < (this->expr_)._M_string_length) {
    cVar3 = (this->expr_)._M_dataplus._M_p[this->index_];
  }
  else {
    cVar3 = '\0';
  }
  iVar1 = (int)cVar3;
  if ((byte)(cVar3 - 0x30U) < 10) {
    uVar2 = iVar1 - 0x30;
  }
  else if ((byte)(cVar3 + 0x9fU) < 6) {
    uVar2 = iVar1 - 0x57;
  }
  else {
    uVar2 = 0x10;
    if ((byte)(cVar3 + 0xbfU) < 6) {
      uVar2 = iVar1 - 0x37;
    }
  }
  return (__int128 *)(ulong)uVar2;
}

Assistant:

bool isEnd() const
  {
    return index_ >= expr_.size();
  }